

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pasteboard.c
# Opt level: O2

wpe_pasteboard * wpe_pasteboard_get_singleton(void)

{
  wpe_pasteboard_interface *pwVar1;
  void *pvVar2;
  wpe_pasteboard *pwVar3;
  uint in_ECX;
  
  if (wpe_pasteboard_get_singleton::s_pasteboard != (wpe_pasteboard *)0x0) {
    return wpe_pasteboard_get_singleton::s_pasteboard;
  }
  wpe_pasteboard_get_singleton::s_pasteboard =
       (wpe_pasteboard *)wpe_calloc_impl(1,0x10,(char *)0x47,in_ECX);
  pwVar1 = (wpe_pasteboard_interface *)wpe_load_object("_wpe_pasteboard_interface");
  pwVar3 = wpe_pasteboard_get_singleton::s_pasteboard;
  if (pwVar1 == (wpe_pasteboard_interface *)0x0) {
    pwVar1 = &generic_pasteboard_interface;
  }
  wpe_pasteboard_get_singleton::s_pasteboard->interface = pwVar1;
  pvVar2 = (*pwVar1->initialize)(pwVar3);
  pwVar3 = wpe_pasteboard_get_singleton::s_pasteboard;
  wpe_pasteboard_get_singleton::s_pasteboard->interface_data = pvVar2;
  return pwVar3;
}

Assistant:

struct wpe_pasteboard*
wpe_pasteboard_get_singleton()
{
    static struct wpe_pasteboard* s_pasteboard = 0;
    if (!s_pasteboard) {
        s_pasteboard = wpe_calloc(1, sizeof(struct wpe_pasteboard));
        s_pasteboard->interface = wpe_load_object("_wpe_pasteboard_interface");
        if (!s_pasteboard->interface)
            s_pasteboard->interface = &generic_pasteboard_interface;
        s_pasteboard->interface_data = s_pasteboard->interface->initialize(s_pasteboard);
    }

    return s_pasteboard;
}